

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O1

void __thiscall Assimp::MD5Importer::LoadMD5AnimFile(MD5Importer *this)

{
  undefined8 *puVar1;
  pointer paVar2;
  double dVar3;
  uint uVar4;
  pointer pcVar5;
  IOSystem *pIVar6;
  pointer pfVar7;
  aiScene *pScene;
  undefined1 auVar8 [16];
  MD5Importer *pMVar9;
  pointer pFVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiAnimation **ppaVar13;
  aiAnimation *paVar14;
  aiNodeAnim **ppaVar15;
  aiNodeAnim *paVar16;
  ulong uVar17;
  aiVectorKey *paVar18;
  aiQuatKey *paVar19;
  float *pfVar20;
  aiNode *paVar21;
  Logger *pLVar22;
  runtime_error *this_00;
  uint i;
  uint uVar23;
  long lVar24;
  aiQuatKey *paVar25;
  ulong uVar26;
  pointer pFVar27;
  aiVector3D *paVar28;
  float *pfVar29;
  float *pfVar30;
  pointer pBVar31;
  pointer pBVar32;
  aiVectorKey *paVar33;
  ulong __n;
  pointer pAVar34;
  float fVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  float fVar38;
  double dVar39;
  string pFile;
  MD5AnimParser animParser;
  MD5Parser parser;
  SkeletonMeshBuilder skeleton_maker;
  float local_50c;
  aiAnimation *local_508;
  float local_4fc;
  MD5Importer *local_4f8;
  aiVectorKey *local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  MD5AnimParser local_4c8;
  pointer local_470;
  double local_468;
  MD5Parser local_460;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [63];
  IOStream *file;
  
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  pcVar5 = (this->mFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,pcVar5,pcVar5 + (this->mFile)._M_string_length);
  std::__cxx11::string::append((char *)&local_4e8);
  pIVar6 = this->pIOHandler;
  paVar2 = (pointer)(local_438 + 0x10);
  local_4f8 = this;
  local_438._0_8_ = paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"rb","");
  iVar11 = (*pIVar6->_vptr_IOSystem[4])(pIVar6,local_4e8._M_dataplus._M_p,local_438._0_8_);
  file = (IOStream *)CONCAT44(extraout_var,iVar11);
  if ((pointer)local_438._0_8_ != paVar2) {
    operator_delete((void *)local_438._0_8_,(ulong)(local_428[0]._M_allocated_capacity + 1));
  }
  if ((file == (IOStream *)0x0) ||
     (iVar11 = (*file->_vptr_IOStream[6])(file), CONCAT44(extraout_var_00,iVar11) == 0)) {
    pLVar22 = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                   "Failed to read MD5ANIM file: ",&local_4e8);
    Logger::warn(pLVar22,(char *)local_438._0_8_);
    if ((pointer)local_438._0_8_ != paVar2) {
      operator_delete((void *)local_438._0_8_,(ulong)(local_428[0]._M_allocated_capacity + 1));
    }
  }
  else {
    LoadFileIntoMemory(local_4f8,file);
    pMVar9 = local_4f8;
    MD5::MD5Parser::MD5Parser(&local_460,local_4f8->mBuffer,local_4f8->fileSize);
    MD5::MD5AnimParser::MD5AnimParser(&local_4c8,&local_460.mSections);
    if ((local_4c8.mAnimatedBones.
         super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         local_4c8.mAnimatedBones.
         super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>.
         _M_impl.super__Vector_impl_data._M_finish) ||
       ((local_4c8.mFrames.
         super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl
         .super__Vector_impl_data._M_start ==
         local_4c8.mFrames.
         super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl
         .super__Vector_impl_data._M_finish ||
        (((long)local_4c8.mBaseFrames.
                super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_4c8.mBaseFrames.
                super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
         ((long)local_4c8.mAnimatedBones.
                super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_4c8.mAnimatedBones.
                super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xfc0fc0fc0fc0fc1 != 0)))) {
      pLVar22 = DefaultLogger::get();
      Logger::error(pLVar22,"MD5ANIM: No frames or animated bones loaded");
    }
    else {
      pMVar9->bHadMD5Anim = true;
      pMVar9->pScene->mNumAnimations = 1;
      ppaVar13 = (aiAnimation **)operator_new__(8);
      pMVar9->pScene->mAnimations = ppaVar13;
      paVar14 = (aiAnimation *)operator_new(0x448);
      (paVar14->mName).length = 0;
      (paVar14->mName).data[0] = '\0';
      memset((paVar14->mName).data + 1,0x1b,0x3ff);
      paVar14->mDuration = -1.0;
      paVar14->mTicksPerSecond = 0.0;
      paVar14->mNumChannels = 0;
      paVar14->mChannels = (aiNodeAnim **)0x0;
      paVar14->mNumMeshChannels = 0;
      paVar14->mMeshChannels = (aiMeshAnim **)0x0;
      paVar14->mNumMorphMeshChannels = 0;
      paVar14->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
      *local_4f8->pScene->mAnimations = paVar14;
      uVar12 = (int)((long)local_4c8.mAnimatedBones.
                           super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_4c8.mAnimatedBones.
                           super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3f03f03f;
      paVar14->mNumChannels = uVar12;
      ppaVar15 = (aiNodeAnim **)operator_new__((ulong)uVar12 << 3);
      paVar14->mChannels = ppaVar15;
      local_508 = paVar14;
      if (paVar14->mNumChannels != 0) {
        paVar33 = (aiVectorKey *)0x0;
        do {
          paVar16 = (aiNodeAnim *)operator_new(0x438);
          (paVar16->mNodeName).length = 0;
          (paVar16->mNodeName).data[0] = '\0';
          memset((paVar16->mNodeName).data + 1,0x1b,0x3ff);
          paVar16->mRotationKeys = (aiQuatKey *)0x0;
          paVar16->mNumScalingKeys = 0;
          *(undefined8 *)&paVar16->mNumPositionKeys = 0;
          *(undefined8 *)((long)&paVar16->mPositionKeys + 4) = 0;
          paVar16->mScalingKeys = (aiVectorKey *)0x0;
          paVar16->mPreState = aiAnimBehaviour_DEFAULT;
          paVar16->mPostState = aiAnimBehaviour_DEFAULT;
          local_508->mChannels[(long)paVar33] = paVar16;
          uVar12 = local_4c8.mAnimatedBones.
                   super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)paVar33].
                   super_BaseJointDescription.mName.length;
          if (0x3fe < uVar12) {
            uVar12 = 0x3ff;
          }
          __n = (ulong)uVar12;
          local_438._0_4_ = uVar12;
          local_4f0 = paVar33;
          memcpy(local_438 + 4,
                 local_4c8.mAnimatedBones.
                 super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)paVar33].super_BaseJointDescription
                 .mName.data,__n);
          local_438[__n + 4] = 0;
          (paVar16->mNodeName).length = uVar12;
          memcpy((paVar16->mNodeName).data,local_438 + 4,__n);
          pFVar10 = local_4c8.mFrames.
                    super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pFVar27 = local_4c8.mFrames.
                    super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          paVar33 = local_4f0;
          uVar26 = (long)local_4c8.mFrames.
                         super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_4c8.mFrames.
                         super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = uVar26;
          uVar17 = SUB168(auVar8 * ZEXT816(0x18),0);
          (paVar16->mNodeName).data[__n] = '\0';
          if (SUB168(auVar8 * ZEXT816(0x18),8) != 0) {
            uVar17 = 0xffffffffffffffff;
          }
          paVar18 = (aiVectorKey *)operator_new__(uVar17);
          if (pFVar10 != pFVar27) {
            lVar24 = 0;
            do {
              puVar1 = (undefined8 *)((long)&paVar18->mTime + lVar24);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined4 *)((long)&(paVar18->mValue).z + lVar24) = 0;
              lVar24 = lVar24 + 0x18;
            } while (uVar26 * 0x18 != lVar24);
          }
          paVar16->mPositionKeys = paVar18;
          paVar19 = (aiQuatKey *)operator_new__(uVar17);
          if (pFVar10 != pFVar27) {
            paVar25 = paVar19;
            do {
              paVar25->mTime = 0.0;
              (paVar25->mValue).w = 1.0;
              (paVar25->mValue).x = 0.0;
              (paVar25->mValue).y = 0.0;
              (paVar25->mValue).z = 0.0;
              paVar25 = paVar25 + 1;
            } while (paVar25 != paVar19 + uVar26);
          }
          paVar16->mRotationKeys = paVar19;
          paVar33 = (aiVectorKey *)((long)&paVar33->mTime + 1);
        } while (paVar33 < (aiVectorKey *)(ulong)local_508->mNumChannels);
      }
      local_508->mTicksPerSecond = (double)local_4c8.fFrameRate;
      local_470 = local_4c8.mFrames.
                  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pFVar27 = local_4c8.mFrames.
                super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (local_4c8.mFrames.
          super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_4c8.mFrames.
          super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          dVar39 = (double)pFVar27->iIndex;
          if ((((pFVar27->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start !=
                (pFVar27->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish) ||
              (pFVar27 ==
               local_4c8.mFrames.
               super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>.
               _M_impl.super__Vector_impl_data._M_start)) &&
             (local_4c8.mAnimatedBones.
              super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_4c8.mAnimatedBones.
              super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
              ._M_impl.super__Vector_impl_data._M_finish)) {
            ppaVar15 = local_508->mChannels;
            pBVar32 = local_4c8.mBaseFrames.
                      super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pAVar34 = local_4c8.mAnimatedBones.
                      super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_468 = dVar39;
            do {
              pfVar7 = (pFVar27->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)pAVar34->iFirstKeyIndex <
                  (ulong)((long)(pFVar27->mValues).super__Vector_base<float,_std::allocator<float>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar7 >> 2)) {
                pfVar20 = pfVar7 + pAVar34->iFirstKeyIndex;
                paVar16 = *ppaVar15;
                paVar33 = paVar16->mPositionKeys;
                uVar12 = paVar16->mNumPositionKeys;
                paVar16->mNumPositionKeys = uVar12 + 1;
                local_4f0 = paVar33 + uVar12;
                paVar19 = paVar16->mRotationKeys;
                uVar4 = paVar16->mNumRotationKeys;
                paVar16->mNumRotationKeys = uVar4 + 1;
                uVar23 = 0;
                local_438._0_8_ = local_438._0_8_ & 0xffffffff00000000;
                local_50c = 0.0;
                local_4fc = 0.0;
                pfVar30 = &paVar33[uVar12].mValue.y;
                pfVar29 = &paVar33[uVar12].mValue.z;
                do {
                  if ((pAVar34->iFlags >> (uVar23 & 0x1f) & 1) == 0) {
                    pBVar31 = (pointer)&(pBVar32->vPositionXYZ).z;
                    if ((uVar23 != 2) && (pBVar31 = pBVar32, uVar23 == 1)) {
                      pBVar31 = (pointer)&(pBVar32->vPositionXYZ).y;
                    }
                    paVar28 = (aiVector3D *)pfVar29;
                    if ((uVar23 != 2) && (paVar28 = &paVar33[uVar12].mValue, uVar23 == 1)) {
                      paVar28 = (aiVector3D *)pfVar30;
                    }
                    paVar28->x = (pBVar31->vPositionXYZ).x;
                  }
                  else {
                    paVar28 = (aiVector3D *)pfVar29;
                    if ((uVar23 != 2) && (paVar28 = &paVar33[uVar12].mValue, uVar23 == 1)) {
                      paVar28 = (aiVector3D *)pfVar30;
                    }
                    fVar35 = *pfVar20;
                    pfVar20 = pfVar20 + 1;
                    paVar28->x = fVar35;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 != 3);
                iVar11 = 0;
                do {
                  if ((pAVar34->iFlags >> ((byte)iVar11 & 0x1f) & 8) == 0) {
                    paVar28 = (aiVector3D *)&(pBVar32->vRotationQuat).z;
                    if ((iVar11 != 2) && (paVar28 = &pBVar32->vRotationQuat, iVar11 == 1)) {
                      paVar28 = (aiVector3D *)&(pBVar32->vRotationQuat).y;
                    }
                    pfVar30 = &local_4fc;
                    if ((iVar11 != 2) && (pfVar30 = (float *)local_438, iVar11 == 1)) {
                      pfVar30 = &local_50c;
                    }
                    *pfVar30 = paVar28->x;
                  }
                  else {
                    pfVar30 = &local_4fc;
                    if ((iVar11 != 2) && (pfVar30 = (float *)local_438, iVar11 == 1)) {
                      pfVar30 = &local_50c;
                    }
                    fVar35 = *pfVar20;
                    pfVar20 = pfVar20 + 1;
                    *pfVar30 = fVar35;
                  }
                  iVar11 = iVar11 + 1;
                } while (iVar11 != 3);
                paVar19[uVar4].mValue.x = (float)local_438._0_4_;
                paVar19[uVar4].mValue.y = local_50c;
                paVar19[uVar4].mValue.z = local_4fc;
                fVar35 = ((1.0 - (float)local_438._0_4_ * (float)local_438._0_4_) -
                         local_50c * local_50c) - local_4fc * local_4fc;
                fVar38 = 0.0;
                if (0.0 <= fVar35) {
                  if (fVar35 < 0.0) {
                    fVar38 = sqrtf(fVar35);
                    dVar39 = local_468;
                  }
                  else {
                    fVar38 = SQRT(fVar35);
                  }
                }
                paVar19[uVar4].mValue.w = -fVar38;
                local_4f0->mTime = dVar39;
                paVar19[uVar4].mTime = dVar39;
              }
              else if (pAVar34->iFlags != 0) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_438._0_8_ = local_438 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_438,"MD5: Keyframe index is out of range","");
                std::runtime_error::runtime_error(this_00,(string *)local_438);
                *(undefined ***)this_00 = &PTR__runtime_error_007fa260;
                __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              pAVar34 = pAVar34 + 1;
              ppaVar15 = ppaVar15 + 1;
              pBVar32 = pBVar32 + 1;
            } while (pAVar34 !=
                     local_4c8.mAnimatedBones.
                     super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          dVar3 = local_508->mDuration;
          uVar36 = SUB84(dVar3,0);
          uVar37 = (undefined4)((ulong)dVar3 >> 0x20);
          if (dVar3 <= dVar39) {
            uVar36 = SUB84(dVar39,0);
            uVar37 = (undefined4)((ulong)dVar39 >> 0x20);
          }
          local_508->mDuration = (double)CONCAT44(uVar37,uVar36);
          pFVar27 = pFVar27 + 1;
        } while (pFVar27 != local_470);
      }
      pMVar9 = local_4f8;
      if (local_4f8->pScene->mRootNode == (aiNode *)0x0) {
        paVar21 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar21);
        pMVar9->pScene->mRootNode = paVar21;
        paVar21 = pMVar9->pScene->mRootNode;
        (paVar21->mName).length = 0xf;
        builtin_strncpy((paVar21->mName).data,"<MD5_Hierarchy>",0x10);
        AttachChilds_Anim(pMVar9,-1,pMVar9->pScene->mRootNode,&local_4c8.mAnimatedBones,
                          local_508->mChannels);
        pScene = pMVar9->pScene;
        if (pScene->mRootNode->mNumChildren != 0) {
          SkeletonMeshBuilder::SkeletonMeshBuilder
                    ((SkeletonMeshBuilder *)local_438,pScene,*pScene->mRootNode->mChildren,false);
          SkeletonMeshBuilder::~SkeletonMeshBuilder((SkeletonMeshBuilder *)local_438);
        }
      }
    }
    std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::~vector
              (&local_4c8.mFrames);
    if (local_4c8.mBaseFrames.
        super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4c8.mBaseFrames.
                      super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4c8.mBaseFrames.
                            super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4c8.mBaseFrames.
                            super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4c8.mAnimatedBones.
        super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4c8.mAnimatedBones.
                      super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_4c8.mAnimatedBones.
                            super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_4c8.mAnimatedBones.
                            super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::~vector
              (&local_460.mSections);
  }
  if (file != (IOStream *)0x0) {
    (*file->_vptr_IOStream[1])(file);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MD5Importer::LoadMD5AnimFile ()
{
    std::string pFile = mFile + "md5anim";
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( !file.get() || !file->FileSize())   {
        ASSIMP_LOG_WARN("Failed to read MD5ANIM file: " + pFile);
        return;
    }
    LoadFileIntoMemory(file.get());

    // parse the basic file structure
    MD5::MD5Parser parser(mBuffer,fileSize);

    // load the animation information from the parse tree
    MD5::MD5AnimParser animParser(parser.mSections);

    // generate and fill the output animation
    if (animParser.mAnimatedBones.empty() || animParser.mFrames.empty() ||
        animParser.mBaseFrames.size() != animParser.mAnimatedBones.size())  {
        ASSIMP_LOG_ERROR("MD5ANIM: No frames or animated bones loaded");
    }
    else {
        bHadMD5Anim = true;

        pScene->mAnimations = new aiAnimation*[pScene->mNumAnimations = 1];
        aiAnimation* anim = pScene->mAnimations[0] = new aiAnimation();
        anim->mNumChannels = (unsigned int)animParser.mAnimatedBones.size();
        anim->mChannels = new aiNodeAnim*[anim->mNumChannels];
        for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
            aiNodeAnim* node = anim->mChannels[i] = new aiNodeAnim();
            node->mNodeName = aiString( animParser.mAnimatedBones[i].mName );

            // allocate storage for the keyframes
            node->mPositionKeys = new aiVectorKey[animParser.mFrames.size()];
            node->mRotationKeys = new aiQuatKey[animParser.mFrames.size()];
        }

        // 1 tick == 1 frame
        anim->mTicksPerSecond = animParser.fFrameRate;

        for (FrameList::const_iterator iter = animParser.mFrames.begin(), iterEnd = animParser.mFrames.end();iter != iterEnd;++iter){
            double dTime = (double)(*iter).iIndex;
            aiNodeAnim** pcAnimNode = anim->mChannels;
            if (!(*iter).mValues.empty() || iter == animParser.mFrames.begin()) /* be sure we have at least one frame */
            {
                // now process all values in there ... read all joints
                MD5::BaseFrameDesc* pcBaseFrame = &animParser.mBaseFrames[0];
                for (AnimBoneList::const_iterator iter2 = animParser.mAnimatedBones.begin(); iter2 != animParser.mAnimatedBones.end();++iter2,
                    ++pcAnimNode,++pcBaseFrame)
                {
                    if((*iter2).iFirstKeyIndex >= (*iter).mValues.size()) {

                        // Allow for empty frames
                        if ((*iter2).iFlags != 0) {
                            throw DeadlyImportError("MD5: Keyframe index is out of range");

                        }
                        continue;
                    }
                    const float* fpCur = &(*iter).mValues[(*iter2).iFirstKeyIndex];
                    aiNodeAnim* pcCurAnimBone = *pcAnimNode;

                    aiVectorKey* vKey = &pcCurAnimBone->mPositionKeys[pcCurAnimBone->mNumPositionKeys++];
                    aiQuatKey* qKey = &pcCurAnimBone->mRotationKeys  [pcCurAnimBone->mNumRotationKeys++];
                    aiVector3D vTemp;

                    // translational component
                    for (unsigned int i = 0; i < 3; ++i) {
                        if ((*iter2).iFlags & (1u << i)) {
                            vKey->mValue[i] =  *fpCur++;
                        }
                        else vKey->mValue[i] = pcBaseFrame->vPositionXYZ[i];
                    }

                    // orientation component
                    for (unsigned int i = 0; i < 3; ++i) {
                        if ((*iter2).iFlags & (8u << i)) {
                            vTemp[i] =  *fpCur++;
                        }
                        else vTemp[i] = pcBaseFrame->vRotationQuat[i];
                    }

                    MD5::ConvertQuaternion(vTemp, qKey->mValue);
                    qKey->mTime = vKey->mTime = dTime;
                }
            }

            // compute the duration of the animation
            anim->mDuration = std::max(dTime,anim->mDuration);
        }

        // If we didn't build the hierarchy yet (== we didn't load a MD5MESH),
        // construct it now from the data given in the MD5ANIM.
        if (!pScene->mRootNode) {
            pScene->mRootNode = new aiNode();
            pScene->mRootNode->mName.Set("<MD5_Hierarchy>");

            AttachChilds_Anim(-1,pScene->mRootNode,animParser.mAnimatedBones,(const aiNodeAnim**)anim->mChannels);

            // Call SkeletonMeshBuilder to construct a mesh to represent the shape
            if (pScene->mRootNode->mNumChildren) {
                SkeletonMeshBuilder skeleton_maker(pScene,pScene->mRootNode->mChildren[0]);
            }
        }
    }
}